

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O1

spvc_result spvc_compiler_create_shader_resources(spvc_compiler compiler,spvc_resources *resources)

{
  spvc_context psVar1;
  size_t sVar2;
  bool bVar3;
  _Head_base<0UL,_ScratchMemoryAllocation_*,_false> this;
  spvc_result sVar4;
  ShaderResources accessed_resources;
  undefined1 *local_1a88 [2];
  undefined1 local_1a78 [16];
  undefined1 *local_1a68 [2];
  undefined1 local_1a58 [48];
  ShaderResources local_1a28;
  
  this._M_head_impl = (ScratchMemoryAllocation *)operator_new(0xe10,(nothrow_t *)&std::nothrow);
  if ((spvc_resources_s *)this._M_head_impl == (spvc_resources_s *)0x0) {
    this._M_head_impl = (ScratchMemoryAllocation *)0x0;
  }
  else {
    ((ScratchMemoryAllocation *)&(this._M_head_impl)->_vptr_ScratchMemoryAllocation)->
    _vptr_ScratchMemoryAllocation = (_func_int **)&PTR__spvc_resources_s_0049da60;
    this._M_head_impl[1] = (_func_int **)0x0;
    (((SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 2))->
    super_VectorView<spvc_reflected_resource>).ptr = (spvc_reflected_resource *)0x0;
    *(size_t *)
     &((SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 3))->
      super_VectorView<spvc_reflected_resource> = 0;
    *(size_t *)
     &((SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 4))->
      super_VectorView<spvc_reflected_resource> = 0;
    *(SmallVector<spvc_reflected_resource,_8UL> **)
     &((SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 2))->
      super_VectorView<spvc_reflected_resource> =
         (SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 5);
    *(size_t *)
     &((SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 4))->
      super_VectorView<spvc_reflected_resource> = 8;
    (((SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 0x1d))->
    super_VectorView<spvc_reflected_resource>).ptr = (spvc_reflected_resource *)0x0;
    *(size_t *)
     &((SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 0x1e))->
      super_VectorView<spvc_reflected_resource> = 0;
    *(SmallVector<spvc_reflected_resource,_8UL> **)
     &((SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 0x1d))->
      super_VectorView<spvc_reflected_resource> =
         (SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 0x20);
    *(size_t *)
     &((SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 0x1f))->
      super_VectorView<spvc_reflected_resource> = 8;
    (((SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 0x38))->
    super_VectorView<spvc_reflected_resource>).ptr = (spvc_reflected_resource *)0x0;
    *(size_t *)
     &((SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 0x39))->
      super_VectorView<spvc_reflected_resource> = 0;
    *(SmallVector<spvc_reflected_resource,_8UL> **)
     &((SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 0x38))->
      super_VectorView<spvc_reflected_resource> =
         (SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 0x3b);
    *(size_t *)
     &((SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 0x3a))->
      super_VectorView<spvc_reflected_resource> = 8;
    (((SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 0x53))->
    super_VectorView<spvc_reflected_resource>).ptr = (spvc_reflected_resource *)0x0;
    *(size_t *)
     &((SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 0x54))->
      super_VectorView<spvc_reflected_resource> = 0;
    *(SmallVector<spvc_reflected_resource,_8UL> **)
     &((SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 0x53))->
      super_VectorView<spvc_reflected_resource> =
         (SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 0x56);
    *(size_t *)
     &((SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 0x55))->
      super_VectorView<spvc_reflected_resource> = 8;
    (((SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 0x6e))->
    super_VectorView<spvc_reflected_resource>).ptr = (spvc_reflected_resource *)0x0;
    *(size_t *)
     &((SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 0x6f))->
      super_VectorView<spvc_reflected_resource> = 0;
    *(SmallVector<spvc_reflected_resource,_8UL> **)
     &((SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 0x6e))->
      super_VectorView<spvc_reflected_resource> =
         (SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 0x71);
    *(size_t *)
     &((SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 0x70))->
      super_VectorView<spvc_reflected_resource> = 8;
    (((SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 0x89))->
    super_VectorView<spvc_reflected_resource>).ptr = (spvc_reflected_resource *)0x0;
    *(size_t *)
     &((SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 0x8a))->
      super_VectorView<spvc_reflected_resource> = 0;
    *(size_t *)
     &((SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 0x8b))->
      super_VectorView<spvc_reflected_resource> = 0;
    *(SmallVector<spvc_reflected_resource,_8UL> **)
     &((SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 0x89))->
      super_VectorView<spvc_reflected_resource> =
         (SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 0x8c);
    *(size_t *)
     &((SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 0x8b))->
      super_VectorView<spvc_reflected_resource> = 8;
    *(size_t *)
     &((SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 0xa6))->
      super_VectorView<spvc_reflected_resource> = 0;
    (((SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 0xa4))->
    super_VectorView<spvc_reflected_resource>).ptr = (spvc_reflected_resource *)0x0;
    *(size_t *)
     &((SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 0xa5))->
      super_VectorView<spvc_reflected_resource> = 0;
    *(SmallVector<spvc_reflected_resource,_8UL> **)
     &((SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 0xa4))->
      super_VectorView<spvc_reflected_resource> =
         (SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 0xa7);
    *(size_t *)
     &((SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 0xa6))->
      super_VectorView<spvc_reflected_resource> = 8;
    *(size_t *)
     &((SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 0xc1))->
      super_VectorView<spvc_reflected_resource> = 0;
    (((SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 0xbf))->
    super_VectorView<spvc_reflected_resource>).ptr = (spvc_reflected_resource *)0x0;
    *(size_t *)
     &((SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 0xc0))->
      super_VectorView<spvc_reflected_resource> = 0;
    *(SmallVector<spvc_reflected_resource,_8UL> **)
     &((SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 0xbf))->
      super_VectorView<spvc_reflected_resource> =
         (SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 0xc2);
    *(size_t *)
     &((SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 0xc1))->
      super_VectorView<spvc_reflected_resource> = 8;
    *(size_t *)
     &((SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 0xdc))->
      super_VectorView<spvc_reflected_resource> = 0;
    (((SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 0xda))->
    super_VectorView<spvc_reflected_resource>).ptr = (spvc_reflected_resource *)0x0;
    *(size_t *)
     &((SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 0xdb))->
      super_VectorView<spvc_reflected_resource> = 0;
    *(SmallVector<spvc_reflected_resource,_8UL> **)
     &((SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 0xda))->
      super_VectorView<spvc_reflected_resource> =
         (SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 0xdd);
    *(size_t *)
     &((SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 0xdc))->
      super_VectorView<spvc_reflected_resource> = 8;
    *(size_t *)
     &((SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 0xf7))->
      super_VectorView<spvc_reflected_resource> = 0;
    (((SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 0xf5))->
    super_VectorView<spvc_reflected_resource>).ptr = (spvc_reflected_resource *)0x0;
    *(size_t *)
     &((SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 0xf6))->
      super_VectorView<spvc_reflected_resource> = 0;
    *(SmallVector<spvc_reflected_resource,_8UL> **)
     &((SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 0xf5))->
      super_VectorView<spvc_reflected_resource> =
         (SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 0xf8);
    *(size_t *)
     &((SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 0xf7))->
      super_VectorView<spvc_reflected_resource> = 8;
    *(size_t *)
     &((SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 0x112))->
      super_VectorView<spvc_reflected_resource> = 0;
    (((SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 0x110))->
    super_VectorView<spvc_reflected_resource>).ptr = (spvc_reflected_resource *)0x0;
    *(size_t *)
     &((SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 0x111))->
      super_VectorView<spvc_reflected_resource> = 0;
    *(SmallVector<spvc_reflected_resource,_8UL> **)
     &((SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 0x110))->
      super_VectorView<spvc_reflected_resource> =
         (SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 0x113);
    *(size_t *)
     &((SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 0x112))->
      super_VectorView<spvc_reflected_resource> = 8;
    *(size_t *)
     &((SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 0x12d))->
      super_VectorView<spvc_reflected_resource> = 0;
    (((SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 299))->
    super_VectorView<spvc_reflected_resource>).ptr = (spvc_reflected_resource *)0x0;
    *(size_t *)
     &((SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 300))->
      super_VectorView<spvc_reflected_resource> = 0;
    *(SmallVector<spvc_reflected_resource,_8UL> **)
     &((SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 299))->
      super_VectorView<spvc_reflected_resource> =
         (SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 0x12e);
    *(size_t *)
     &((SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 0x12d))->
      super_VectorView<spvc_reflected_resource> = 8;
    *(size_t *)
     &((SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 0x148))->
      super_VectorView<spvc_reflected_resource> = 0;
    (((SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 0x146))->
    super_VectorView<spvc_reflected_resource>).ptr = (spvc_reflected_resource *)0x0;
    *(size_t *)
     &((SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 0x147))->
      super_VectorView<spvc_reflected_resource> = 0;
    *(SmallVector<spvc_reflected_resource,_8UL> **)
     &((SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 0x146))->
      super_VectorView<spvc_reflected_resource> =
         (SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 0x149);
    *(size_t *)
     &((SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 0x148))->
      super_VectorView<spvc_reflected_resource> = 8;
    *(size_t *)
     &((SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 0x163))->
      super_VectorView<spvc_reflected_resource> = 0;
    (((SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 0x161))->
    super_VectorView<spvc_reflected_resource>).ptr = (spvc_reflected_resource *)0x0;
    *(size_t *)
     &((SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 0x162))->
      super_VectorView<spvc_reflected_resource> = 0;
    *(SmallVector<spvc_reflected_resource,_8UL> **)
     &((SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 0x161))->
      super_VectorView<spvc_reflected_resource> =
         (SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 0x164);
    *(size_t *)
     &((SmallVector<spvc_reflected_resource,_8UL> *)(this._M_head_impl + 0x163))->
      super_VectorView<spvc_reflected_resource> = 8;
    *(size_t *)
     &((SmallVector<spvc_reflected_builtin_resource,_8UL> *)(this._M_head_impl + 0x17e))->
      super_VectorView<spvc_reflected_builtin_resource> = 0;
    (((SmallVector<spvc_reflected_builtin_resource,_8UL> *)(this._M_head_impl + 0x17c))->
    super_VectorView<spvc_reflected_builtin_resource>).ptr = (spvc_reflected_builtin_resource *)0x0;
    *(size_t *)
     &((SmallVector<spvc_reflected_builtin_resource,_8UL> *)(this._M_head_impl + 0x17d))->
      super_VectorView<spvc_reflected_builtin_resource> = 0;
    *(SmallVector<spvc_reflected_builtin_resource,_8UL> **)
     &((SmallVector<spvc_reflected_builtin_resource,_8UL> *)(this._M_head_impl + 0x17c))->
      super_VectorView<spvc_reflected_builtin_resource> =
         (SmallVector<spvc_reflected_builtin_resource,_8UL> *)(this._M_head_impl + 0x17f);
    *(size_t *)
     &((SmallVector<spvc_reflected_builtin_resource,_8UL> *)(this._M_head_impl + 0x17e))->
      super_VectorView<spvc_reflected_builtin_resource> = 8;
    *(size_t *)
     &((SmallVector<spvc_reflected_builtin_resource,_8UL> *)(this._M_head_impl + 0x1a1))->
      super_VectorView<spvc_reflected_builtin_resource> = 0;
    (((SmallVector<spvc_reflected_builtin_resource,_8UL> *)(this._M_head_impl + 0x19f))->
    super_VectorView<spvc_reflected_builtin_resource>).ptr = (spvc_reflected_builtin_resource *)0x0;
    *(size_t *)
     &((SmallVector<spvc_reflected_builtin_resource,_8UL> *)(this._M_head_impl + 0x1a0))->
      super_VectorView<spvc_reflected_builtin_resource> = 0;
    *(SmallVector<spvc_reflected_builtin_resource,_8UL> **)
     &((SmallVector<spvc_reflected_builtin_resource,_8UL> *)(this._M_head_impl + 0x19f))->
      super_VectorView<spvc_reflected_builtin_resource> =
         (SmallVector<spvc_reflected_builtin_resource,_8UL> *)(this._M_head_impl + 0x1a2);
    *(size_t *)
     &((SmallVector<spvc_reflected_builtin_resource,_8UL> *)(this._M_head_impl + 0x1a1))->
      super_VectorView<spvc_reflected_builtin_resource> = 8;
  }
  psVar1 = compiler->context;
  if (this._M_head_impl == (ScratchMemoryAllocation *)0x0) {
    local_1a68[0] = local_1a58;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a68,"Out of memory.","");
    std::__cxx11::string::operator=((string *)psVar1,(string *)local_1a68);
    if (psVar1->callback != (spvc_error_callback)0x0) {
      (*psVar1->callback)(psVar1->callback_userdata,(psVar1->last_error)._M_dataplus._M_p);
    }
    sVar4 = SPVC_ERROR_OUT_OF_MEMORY;
    if (local_1a68[0] != local_1a58) {
      operator_delete(local_1a68[0]);
    }
  }
  else {
    *(spvc_context *)((long)this._M_head_impl + 8) = psVar1;
    spirv_cross::Compiler::get_shader_resources
              (&local_1a28,
               (compiler->compiler)._M_t.
               super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>
               ._M_t.
               super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>
               .super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl);
    bVar3 = spvc_resources_s::copy_resources((spvc_resources_s *)this._M_head_impl,&local_1a28);
    if (bVar3) {
      *resources = (spvc_resources)this._M_head_impl;
      psVar1 = compiler->context;
      spirv_cross::
      SmallVector<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>,_8UL>
      ::reserve(&psVar1->allocations,
                (psVar1->allocations).
                super_VectorView<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>_>
                .buffer_size + 1);
      sVar2 = (psVar1->allocations).
              super_VectorView<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>_>
              .buffer_size;
      (psVar1->allocations).
      super_VectorView<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>_>
      .ptr[sVar2]._M_t.
      super___uniq_ptr_impl<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>.
      _M_t.
      super__Tuple_impl<0UL,_ScratchMemoryAllocation_*,_std::default_delete<ScratchMemoryAllocation>_>
      .super__Head_base<0UL,_ScratchMemoryAllocation_*,_false> =
           (_Head_base<0UL,_ScratchMemoryAllocation_*,_false>)this._M_head_impl;
      (psVar1->allocations).
      super_VectorView<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>_>
      .buffer_size = sVar2 + 1;
      sVar4 = SPVC_SUCCESS;
      this._M_head_impl = (ScratchMemoryAllocation *)0x0;
    }
    else {
      psVar1 = *(spvc_context *)((long)this._M_head_impl + 8);
      local_1a88[0] = local_1a78;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a88,"Out of memory.","");
      std::__cxx11::string::operator=((string *)psVar1,(string *)local_1a88);
      if (psVar1->callback != (spvc_error_callback)0x0) {
        (*psVar1->callback)(psVar1->callback_userdata,(psVar1->last_error)._M_dataplus._M_p);
      }
      sVar4 = SPVC_ERROR_OUT_OF_MEMORY;
      if (local_1a88[0] != local_1a78) {
        operator_delete(local_1a88[0]);
      }
    }
    spirv_cross::ShaderResources::~ShaderResources(&local_1a28);
  }
  if ((spvc_resources_s *)this._M_head_impl != (spvc_resources_s *)0x0) {
    (*(this._M_head_impl)->_vptr_ScratchMemoryAllocation[1])(this._M_head_impl);
  }
  return sVar4;
}

Assistant:

spvc_result spvc_compiler_create_shader_resources(spvc_compiler compiler, spvc_resources *resources)
{
	SPVC_BEGIN_SAFE_SCOPE
	{
		std::unique_ptr<spvc_resources_s> res(new (std::nothrow) spvc_resources_s);
		if (!res)
		{
			compiler->context->report_error("Out of memory.");
			return SPVC_ERROR_OUT_OF_MEMORY;
		}

		res->context = compiler->context;
		auto accessed_resources = compiler->compiler->get_shader_resources();

		if (!res->copy_resources(accessed_resources))
		{
			res->context->report_error("Out of memory.");
			return SPVC_ERROR_OUT_OF_MEMORY;
		}

		*resources = res.get();
		compiler->context->allocations.push_back(std::move(res));
	}